

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O0

size_t __thiscall CASC_CSV::LoadHeader(CASC_CSV *this,void *pvListFile)

{
  size_t local_30;
  size_t nCount;
  char *szLineEnd;
  char *szLineBegin;
  void *pvListFile_local;
  CASC_CSV *this_local;
  
  local_30 = 0;
  szLineBegin = (char *)pvListFile;
  pvListFile_local = this;
  ListFile_GetNextLine(pvListFile,&szLineEnd,(char **)&nCount);
  if (szLineEnd < nCount) {
    local_30 = LoadHeader(this,szLineEnd,(char *)nCount);
  }
  return local_30;
}

Assistant:

size_t CASC_CSV::LoadHeader(void * pvListFile)
{
    const char * szLineBegin;
    const char * szLineEnd;
    size_t nCount = 0;

    ListFile_GetNextLine(pvListFile, &szLineBegin, &szLineEnd);
    if (szLineBegin < szLineEnd)
    {
        nCount = LoadHeader(szLineBegin, szLineEnd);
    }

    return nCount;
}